

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O3

bool __thiscall
cmCTestRunTest::EndTest(cmCTestRunTest *this,size_t completed,size_t total,bool started)

{
  ulong uVar1;
  pointer ppVar2;
  pointer pcVar3;
  cmCTest *pcVar4;
  cmCTestTestHandler *this_00;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  State SVar8;
  Exception EVar9;
  int iVar10;
  size_t sVar11;
  long *plVar12;
  ostream *poVar13;
  cmProcess *pcVar14;
  cmCTestTestProperties *pcVar15;
  undefined7 in_register_00000009;
  ulong *puVar16;
  size_type *psVar17;
  long lVar18;
  State SVar19;
  long lVar20;
  pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pass;
  pointer ppVar21;
  char *pcVar22;
  char *pcVar23;
  bool bVar24;
  double dVar25;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string output;
  string testName;
  string reason;
  ostringstream cmCTestLog_msg_1;
  ostringstream outputStream;
  char buf [1024];
  byte local_7d0;
  string local_7c8;
  int local_7a4;
  string local_7a0;
  unique_ptr<cmProcess,_std::default_delete<cmProcess>_> *local_780;
  size_t local_778;
  char *local_770;
  char *local_768;
  char local_760;
  undefined7 uStack_75f;
  size_t local_750;
  undefined1 local_748 [112];
  ios_base local_6d8 [264];
  long *local_5d0;
  long local_5c0 [2];
  undefined1 local_5b0 [8];
  undefined1 *local_5a8;
  undefined1 local_5a0 [96];
  ios_base local_540 [264];
  undefined1 local_438 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  undefined8 local_418;
  undefined1 *local_410;
  ios_base local_3c8 [920];
  
  local_778 = completed;
  local_750 = total;
  WriteLogOutputTop(this,completed,total);
  local_770 = &local_760;
  local_768 = (char *)0x0;
  local_760 = '\0';
  SVar8 = Error;
  local_7a4 = (int)CONCAT71(in_register_00000009,started);
  if (local_7a4 == 0) {
LAB_001dedde:
    this->TimeoutIsForStopTime = false;
    SVar19 = SVar8;
  }
  else {
    SVar8 = cmProcess::GetProcessStatus
                      ((this->TestProcess)._M_t.
                       super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
                       super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
                       super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl);
    SVar19 = Expired;
    if (SVar8 != Expired) goto LAB_001dedde;
  }
  uVar1 = ((this->TestProcess)._M_t.
           super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
           super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
           super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl)->ExitValue;
  ppVar21 = (this->TestProperties->RequiredRegularExpressions).
            super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->TestProperties->RequiredRegularExpressions).
           super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = false;
  if ((ppVar21 != ppVar2) &&
     ((this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
    do {
      bVar6 = cmsys::RegularExpression::find
                        (&ppVar21->first,(this->ProcessOutput)._M_dataplus._M_p,
                         (RegularExpressionMatch *)ppVar21);
      if (bVar6) {
        local_428._8_8_ = (ppVar21->second)._M_dataplus._M_p;
        local_428._M_allocated_capacity = (ppVar21->second)._M_string_length;
        local_438._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x2a;
        local_438._8_8_ = "Required regular expression found. Regex=[";
        local_5a8 = local_5a0;
        local_5b0 = (undefined1  [8])0x1;
        local_5a0[0] = 0x5d;
        local_418 = 1;
        views._M_len = 3;
        views._M_array = (iterator)local_438;
        local_410 = local_5a8;
        cmCatViews_abi_cxx11_((string *)local_748,views);
        std::__cxx11::string::operator=((string *)&local_770,(string *)local_748);
        if ((undefined1 *)local_748._0_8_ != local_748 + 0x10) {
          operator_delete((void *)local_748._0_8_,local_748._16_8_ + 1);
        }
        bVar6 = false;
        goto LAB_001def63;
      }
      ppVar21 = ppVar21 + 1;
    } while (ppVar21 != ppVar2);
    std::__cxx11::string::_M_replace((ulong)&local_770,0,local_768,0x743b0a);
    ppVar21 = (this->TestProperties->RequiredRegularExpressions).
              super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (this->TestProperties->RequiredRegularExpressions).
             super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar21 != ppVar2) {
      do {
        std::__cxx11::string::_M_append
                  ((char *)&local_770,(ulong)(ppVar21->second)._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&local_770);
        ppVar21 = ppVar21 + 1;
      } while (ppVar21 != ppVar2);
    }
    bVar6 = true;
    std::__cxx11::string::append((char *)&local_770);
  }
LAB_001def63:
  ppVar21 = (this->TestProperties->ErrorRegularExpressions).
            super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->TestProperties->ErrorRegularExpressions).
           super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((ppVar21 != ppVar2) &&
     ((this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
    do {
      bVar7 = cmsys::RegularExpression::find
                        (&ppVar21->first,(this->ProcessOutput)._M_dataplus._M_p,
                         (RegularExpressionMatch *)ppVar21);
      if (bVar7) {
        local_428._8_8_ = (ppVar21->second)._M_dataplus._M_p;
        local_428._M_allocated_capacity = (ppVar21->second)._M_string_length;
        local_438._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x31;
        local_438._8_8_ = "Error regular expression found in output. Regex=[";
        local_5a8 = local_5a0;
        local_5b0 = (undefined1  [8])0x1;
        local_5a0[0] = 0x5d;
        local_418 = 1;
        views_00._M_len = 3;
        views_00._M_array = (iterator)local_438;
        local_410 = local_5a8;
        cmCatViews_abi_cxx11_((string *)local_748,views_00);
        std::__cxx11::string::operator=((string *)&local_770,(string *)local_748);
        if ((undefined1 *)local_748._0_8_ != local_748 + 0x10) {
          operator_delete((void *)local_748._0_8_,local_748._16_8_ + 1);
        }
        bVar6 = true;
        break;
      }
      ppVar21 = ppVar21 + 1;
    } while (ppVar21 != ppVar2);
  }
  ppVar21 = (this->TestProperties->SkipRegularExpressions).
            super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->TestProperties->SkipRegularExpressions).
           super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar7 = false;
  if ((ppVar21 != ppVar2) &&
     (bVar7 = false,
     (this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
    do {
      bVar7 = cmsys::RegularExpression::find
                        (&ppVar21->first,(this->ProcessOutput)._M_dataplus._M_p,
                         (RegularExpressionMatch *)ppVar21);
      if (bVar7) {
        local_428._8_8_ = (ppVar21->second)._M_dataplus._M_p;
        local_428._M_allocated_capacity = (ppVar21->second)._M_string_length;
        local_438._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x30;
        local_438._8_8_ = "Skip regular expression found in output. Regex=[";
        local_5a8 = local_5a0;
        local_5b0 = (undefined1  [8])0x1;
        local_5a0[0] = 0x5d;
        local_418 = 1;
        views_01._M_len = 3;
        views_01._M_array = (iterator)local_438;
        local_410 = local_5a8;
        cmCatViews_abi_cxx11_((string *)local_748,views_01);
        std::__cxx11::string::operator=((string *)&local_770,(string *)local_748);
        if ((undefined1 *)local_748._0_8_ != local_748 + 0x10) {
          operator_delete((void *)local_748._0_8_,local_748._16_8_ + 1);
        }
        bVar7 = true;
        goto LAB_001df135;
      }
      ppVar21 = ppVar21 + 1;
    } while (ppVar21 != ppVar2);
    bVar7 = false;
  }
LAB_001df135:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
  local_780 = &this->TestProcess;
  if (SVar19 == Exception) {
    bVar6 = cmCTest::GetOutputTestOutputOnTestFailure(this->CTest);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,"***Exception: ",0xe);
    cmProcess::GetExitExceptionString_abi_cxx11_
              ((string *)local_438,
               (local_780->_M_t).super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>.
               _M_t.super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
               super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl);
    std::__cxx11::string::operator=
              ((string *)&(this->TestResult).ExceptionStatus,(string *)local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._0_8_ != &local_428) {
      operator_delete((void *)local_438._0_8_,local_428._M_allocated_capacity + 1);
    }
    EVar9 = cmProcess::GetExitException
                      ((local_780->_M_t).
                       super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
                       super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
                       super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl);
    switch(EVar9) {
    case Fault:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,"SegFault",8);
      (this->TestResult).Status = 2;
      break;
    case Illegal:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,"Illegal",7);
      (this->TestResult).Status = 3;
      break;
    case Interrupt:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,"Interrupt",9);
      (this->TestResult).Status = 4;
      break;
    case Numerical:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,"Numerical",9);
      (this->TestResult).Status = 5;
      break;
    default:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_438,(this->TestResult).ExceptionStatus._M_dataplus._M_p,
                 (this->TestResult).ExceptionStatus._M_string_length);
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xd8,(char *)local_748._0_8_,false);
      if ((undefined1 *)local_748._0_8_ != local_748 + 0x10) {
        operator_delete((void *)local_748._0_8_,local_748._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
      std::ios_base::~ios_base(local_3c8);
      (this->TestResult).Status = 6;
    }
  }
  else if (SVar19 == Expired) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,"***Timeout ",0xb);
    (this->TestResult).Status = 1;
    bVar6 = cmCTest::GetOutputTestOutputOnTestFailure(this->CTest);
  }
  else {
    if (SVar19 == Exited) {
      if (bVar6) {
        pcVar15 = this->TestProperties;
        bVar6 = false;
      }
      else {
        pcVar15 = this->TestProperties;
        if (uVar1 == 0) {
          bVar6 = true;
        }
        else {
          bVar6 = (pcVar15->RequiredRegularExpressions).
                  super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (pcVar15->RequiredRegularExpressions).
                  super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      if ((bool)((uVar1 == (uint)pcVar15->SkipReturnCode && -1 < pcVar15->SkipReturnCode) | bVar7))
      {
        (this->TestResult).Status = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
        if (bVar7) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_438,"SKIP_REGULAR_EXPRESSION_MATCHED",0x1f);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_438,"SKIP_RETURN_CODE=",0x11);
          std::ostream::operator<<(local_438,this->TestProperties->SkipReturnCode);
        }
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=
                  ((string *)&(this->TestResult).CompletionStatus,(string *)local_748);
        if ((undefined1 *)local_748._0_8_ != local_748 + 0x10) {
          operator_delete((void *)local_748._0_8_,local_748._16_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,"***Skipped ",0xb);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
        std::ios_base::~ios_base(local_3c8);
        local_7d0 = 1;
        bVar6 = false;
        goto LAB_001df2b5;
      }
      if (bVar6 == pcVar15->WillFail) {
        (this->TestResult).Status = 7;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,"***Failed  ",0xb);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_5b0,local_770,(long)local_768);
        bVar6 = cmCTest::GetOutputTestOutputOnTestFailure(this->CTest);
        goto LAB_001df2ad;
      }
      (this->TestResult).Status = 9;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,"   Passed  ",0xb);
    }
    else {
      iVar10 = std::__cxx11::string::compare((char *)&(this->TestResult).CompletionStatus);
      pcVar22 = "***Not Run ";
      if (iVar10 == 0) {
        pcVar22 = "***Not Run (Disabled) ";
      }
      lVar18 = 0xb;
      if (iVar10 == 0) {
        lVar18 = 0x16;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,pcVar22,lVar18);
    }
    bVar6 = false;
  }
LAB_001df2ad:
  local_7d0 = 0;
LAB_001df2b5:
  iVar10 = (this->TestResult).Status;
  snprintf(local_438,0x400,"%6.2f sec",
           SUB84((((this->TestProcess)._M_t.
                   super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
                   super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
                   super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl)->TotalTime).__r,0));
  sVar11 = strlen(local_438);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,local_438,sVar11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,"\n",1);
  bVar7 = cmCTest::GetTestProgressOutput(this->CTest);
  bVar24 = (bool)(iVar10 == 9 | local_7d0);
  if (bVar7) {
    if (bVar24 == false) {
      GetTestPrefix_abi_cxx11_(&local_7c8,this,local_778,local_750);
      local_7a0._M_dataplus._M_p = (pointer)&local_7a0.field_2;
      pcVar3 = (this->TestProperties->Name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_7a0,pcVar3,pcVar3 + (this->TestProperties->Name)._M_string_length)
      ;
      iVar10 = cmCTest::GetMaxTestNameWidth(this->CTest);
      std::__cxx11::string::resize((ulong)&local_7a0,(char)iVar10 + '\x04');
      std::__cxx11::string::_M_append((char *)&local_7c8,(ulong)local_7a0._M_dataplus._M_p);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)&local_7c8,local_748._0_8_);
      puVar16 = (ulong *)(local_748 + 0x10);
      if ((ulong *)local_748._0_8_ != puVar16) {
        operator_delete((void *)local_748._0_8_,local_748._16_8_ + 1);
      }
      local_748._0_8_ = puVar16;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"");
      std::__cxx11::stringbuf::str((string *)&local_5a8);
      if ((ulong *)local_748._0_8_ != puVar16) {
        operator_delete((void *)local_748._0_8_,local_748._16_8_ + 1);
      }
      std::ios::clear((int)(ostream *)local_5b0 + (int)*(_func_int **)((long)local_5b0 + -0x18));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_5b0,local_7c8._M_dataplus._M_p,local_7c8._M_string_length);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_748);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_748,"\n",1);
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xf6,(char *)local_5d0,false);
      if (local_5d0 != local_5c0) {
        operator_delete(local_5d0,local_5c0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_748);
      std::ios_base::~ios_base(local_6d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
        operator_delete(local_7a0._M_dataplus._M_p,local_7a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
        operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_778 == local_750) {
      GetTestPrefix_abi_cxx11_(&local_7a0,this,local_778,local_778);
      plVar12 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_7a0,
                                   (ulong)(this->TestProperties->Name)._M_dataplus._M_p);
      puVar16 = (ulong *)(plVar12 + 2);
      if ((ulong *)*plVar12 == puVar16) {
        local_748._16_8_ = *puVar16;
        local_748._24_8_ = plVar12[3];
        local_748._0_8_ = local_748 + 0x10;
      }
      else {
        local_748._16_8_ = *puVar16;
        local_748._0_8_ = (ulong *)*plVar12;
      }
      local_748._8_8_ = plVar12[1];
      *plVar12 = (long)puVar16;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append(local_748);
      psVar17 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_7c8.field_2._M_allocated_capacity = *psVar17;
        local_7c8.field_2._8_8_ = plVar12[3];
        local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
      }
      else {
        local_7c8.field_2._M_allocated_capacity = *psVar17;
        local_7c8._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_7c8._M_string_length = plVar12[1];
      *plVar12 = (long)psVar17;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      if ((undefined1 *)local_748._0_8_ != local_748 + 0x10) {
        operator_delete((void *)local_748._0_8_,local_748._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
        operator_delete(local_7a0._M_dataplus._M_p,local_7a0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_748);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_748,local_7c8._M_dataplus._M_p,local_7c8._M_string_length);
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xfb,local_7a0._M_dataplus._M_p,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
        operator_delete(local_7a0._M_dataplus._M_p,local_7a0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_748);
      std::ios_base::~ios_base(local_6d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
        operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  bVar7 = cmCTest::GetTestProgressOutput(this->CTest);
  if ((bVar7 & bVar24) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_748);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_748,local_7c8._M_dataplus._M_p,local_7c8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
      operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
    }
    pcVar4 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0xff,local_7c8._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
      operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_748);
    std::ios_base::~ios_base(local_6d8);
  }
  if (bVar6 != false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_748);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_748,(this->ProcessOutput)._M_dataplus._M_p,
                         (this->ProcessOutput)._M_string_length);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    pcVar4 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x103,local_7c8._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
      operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_748);
    std::ios_base::~ios_base(local_6d8);
  }
  poVar13 = this->TestHandler->LogFile;
  if (poVar13 != (ostream *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"Test time = ",0xc);
    sVar11 = strlen(local_438);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,local_438,sVar11);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
  }
  ParseOutputForMeasurements(this);
  if (((char)local_7a4 != '\0') && (this_00 = this->TestHandler, this_00->MemCheck == false)) {
    cmCTestTestHandler::CleanTestOutput
              (this_00,&this->ProcessOutput,
               (long)(&this_00->CustomMaximumPassedTestOutputSize)[(this->TestResult).Status != 9],
               this_00->TestOutputTruncation);
  }
  std::__cxx11::string::_M_assign((string *)&(this->TestResult).Reason);
  if (this->TestHandler->LogFile != (ostream *)0x0) {
    iVar10 = (this->TestResult).Status;
    pcVar22 = "Test Pass Reason";
    pcVar23 = "Test Passed.\n";
    if ((iVar10 != 0) && (iVar10 != 9)) {
      pcVar22 = "Test Fail Reason";
      pcVar23 = "Test Failed.\n";
    }
    dVar25 = (((this->TestProcess)._M_t.
               super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
               super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
               super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl)->TotalTime).__r;
    lVar18 = (long)(dVar25 / 3600.0);
    dVar25 = dVar25 - (double)lVar18 * 3600.0;
    lVar20 = (long)(dVar25 / 60.0);
    snprintf(local_748,100,"%02d:%02d:%02d",lVar18,lVar20,(long)(dVar25 - (double)lVar20 * 60.0));
    poVar13 = this->TestHandler->LogFile;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"----------------------------------------------------------",0x3a);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    poVar13 = this->TestHandler->LogFile;
    if ((this->TestResult).Reason._M_string_length == 0) {
      lVar18 = 0xd;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar22,0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,":\n",2);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,(this->TestResult).Reason._M_dataplus._M_p,
                           (this->TestResult).Reason._M_string_length);
      lVar18 = 1;
      pcVar23 = "\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar23,lVar18);
    poVar13 = this->TestHandler->LogFile;
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\"",1);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,(this->TestProperties->Name)._M_dataplus._M_p,
                         (this->TestProperties->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\" end time: ",0xc);
    cmCTest::CurrentTime_abi_cxx11_(&local_7c8,this->CTest);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,local_7c8._M_dataplus._M_p,local_7c8._M_string_length);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    poVar13 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\"",1);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,(this->TestProperties->Name)._M_dataplus._M_p,
                         (this->TestProperties->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\" time elapsed: ",0x10);
    sVar11 = strlen(local_748);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,local_748,sVar11);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    poVar13 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"----------------------------------------------------------",0x3a);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    plVar12 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
    std::ostream::put((char)plVar12);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
      operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((char)local_7a4 != '\0') {
    puVar16 = (ulong *)(local_748 + 0x10);
    local_748._8_8_ = 0;
    local_748._16_8_ = local_748._16_8_ & 0xffffffffffffff00;
    local_748._0_8_ = puVar16;
    if ((this->TestHandler->MemCheck == false) &&
       (bVar6 = cmCTest::ShouldCompressTestOutput(this->CTest), bVar6)) {
      pcVar3 = (this->ProcessOutput)._M_dataplus._M_p;
      local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_7c8,pcVar3,pcVar3 + (this->ProcessOutput)._M_string_length);
      bVar6 = cmCTest::CompressString(this->CTest,&local_7c8);
      if (bVar6) {
        std::__cxx11::string::operator=((string *)local_748,(string *)&local_7c8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
        operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
      }
    }
    uVar5 = local_748._8_8_;
    bVar6 = (ulong)local_748._8_8_ < (this->ProcessOutput)._M_string_length;
    std::__cxx11::string::_M_assign((string *)&(this->TestResult).Output);
    (this->TestResult).CompressOutput = uVar5 != 0 && bVar6;
    pcVar14 = (this->TestProcess)._M_t.
              super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
              super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
              super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl;
    (this->TestResult).ReturnValue = pcVar14->ExitValue;
    if (local_7d0 == 0) {
      std::__cxx11::string::_M_replace
                ((ulong)&(this->TestResult).CompletionStatus,0,
                 (char *)(this->TestResult).CompletionStatus._M_string_length,0x73be2a);
      pcVar14 = (local_780->_M_t).super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>.
                _M_t.super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
                super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl;
    }
    (this->TestResult).ExecutionTime.__r = (pcVar14->TotalTime).__r;
    MemCheckPostProcess(this);
    if ((this->TestResult).Status == 9) {
      pcVar15 = this->TestProperties;
      dVar25 = (double)pcVar15->PreviousRuns;
      pcVar15->Cost =
           (float)(((double)pcVar15->Cost * dVar25 + (this->TestResult).ExecutionTime.__r) /
                  (dVar25 + 1.0));
      pcVar15->PreviousRuns = pcVar15->PreviousRuns + 1;
    }
    if ((ulong *)local_748._0_8_ != puVar16) {
      operator_delete((void *)local_748._0_8_,local_748._16_8_ + 1);
    }
  }
  bVar6 = NeedsToRepeat(this);
  if (!bVar6) {
    std::
    vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
    ::push_back(&this->TestHandler->TestResults,&this->TestResult);
  }
  std::__uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>::reset
            ((__uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_> *)local_780,(pointer)0x0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
  std::ios_base::~ios_base(local_540);
  if (local_770 != &local_760) {
    operator_delete(local_770,CONCAT71(uStack_75f,local_760) + 1);
  }
  return bVar24;
}

Assistant:

bool cmCTestRunTest::EndTest(size_t completed, size_t total, bool started)
{
  this->WriteLogOutputTop(completed, total);
  std::string reason;
  bool passed = true;
  cmProcess::State res =
    started ? this->TestProcess->GetProcessStatus() : cmProcess::State::Error;
  if (res != cmProcess::State::Expired) {
    this->TimeoutIsForStopTime = false;
  }
  std::int64_t retVal = this->TestProcess->GetExitValue();
  bool forceFail = false;
  bool forceSkip = false;
  bool skipped = false;
  bool outputTestErrorsToConsole = false;
  if (!this->TestProperties->RequiredRegularExpressions.empty() &&
      this->FailedDependencies.empty()) {
    bool found = false;
    for (auto& pass : this->TestProperties->RequiredRegularExpressions) {
      if (pass.first.find(this->ProcessOutput)) {
        found = true;
        reason = cmStrCat("Required regular expression found. Regex=[",
                          pass.second, ']');
        break;
      }
    }
    if (!found) {
      reason = "Required regular expression not found. Regex=[";
      for (auto& pass : this->TestProperties->RequiredRegularExpressions) {
        reason += pass.second;
        reason += "\n";
      }
      reason += "]";
      forceFail = true;
    }
  }
  if (!this->TestProperties->ErrorRegularExpressions.empty() &&
      this->FailedDependencies.empty()) {
    for (auto& fail : this->TestProperties->ErrorRegularExpressions) {
      if (fail.first.find(this->ProcessOutput)) {
        reason = cmStrCat("Error regular expression found in output. Regex=[",
                          fail.second, ']');
        forceFail = true;
        break;
      }
    }
  }
  if (!this->TestProperties->SkipRegularExpressions.empty() &&
      this->FailedDependencies.empty()) {
    for (auto& skip : this->TestProperties->SkipRegularExpressions) {
      if (skip.first.find(this->ProcessOutput)) {
        reason = cmStrCat("Skip regular expression found in output. Regex=[",
                          skip.second, ']');
        forceSkip = true;
        break;
      }
    }
  }
  std::ostringstream outputStream;
  if (res == cmProcess::State::Exited) {
    bool success = !forceFail &&
      (retVal == 0 ||
       !this->TestProperties->RequiredRegularExpressions.empty());
    if ((this->TestProperties->SkipReturnCode >= 0 &&
         this->TestProperties->SkipReturnCode == retVal) ||
        forceSkip) {
      this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
      std::ostringstream s;
      if (forceSkip) {
        s << "SKIP_REGULAR_EXPRESSION_MATCHED";
      } else {
        s << "SKIP_RETURN_CODE=" << this->TestProperties->SkipReturnCode;
      }
      this->TestResult.CompletionStatus = s.str();
      outputStream << "***Skipped ";
      skipped = true;
    } else if (success != this->TestProperties->WillFail) {
      this->TestResult.Status = cmCTestTestHandler::COMPLETED;
      outputStream << "   Passed  ";
    } else {
      this->TestResult.Status = cmCTestTestHandler::FAILED;
      outputStream << "***Failed  " << reason;
      outputTestErrorsToConsole =
        this->CTest->GetOutputTestOutputOnTestFailure();
    }
  } else if (res == cmProcess::State::Expired) {
    outputStream << "***Timeout ";
    this->TestResult.Status = cmCTestTestHandler::TIMEOUT;
    outputTestErrorsToConsole =
      this->CTest->GetOutputTestOutputOnTestFailure();
  } else if (res == cmProcess::State::Exception) {
    outputTestErrorsToConsole =
      this->CTest->GetOutputTestOutputOnTestFailure();
    outputStream << "***Exception: ";
    this->TestResult.ExceptionStatus =
      this->TestProcess->GetExitExceptionString();
    switch (this->TestProcess->GetExitException()) {
      case cmProcess::Exception::Fault:
        outputStream << "SegFault";
        this->TestResult.Status = cmCTestTestHandler::SEGFAULT;
        break;
      case cmProcess::Exception::Illegal:
        outputStream << "Illegal";
        this->TestResult.Status = cmCTestTestHandler::ILLEGAL;
        break;
      case cmProcess::Exception::Interrupt:
        outputStream << "Interrupt";
        this->TestResult.Status = cmCTestTestHandler::INTERRUPT;
        break;
      case cmProcess::Exception::Numerical:
        outputStream << "Numerical";
        this->TestResult.Status = cmCTestTestHandler::NUMERICAL;
        break;
      default:
        cmCTestLog(this->CTest, HANDLER_OUTPUT,
                   this->TestResult.ExceptionStatus);
        this->TestResult.Status = cmCTestTestHandler::OTHER_FAULT;
    }
  } else if ("Disabled" == this->TestResult.CompletionStatus) {
    outputStream << "***Not Run (Disabled) ";
  } else // cmProcess::State::Error
  {
    outputStream << "***Not Run ";
  }

  passed = this->TestResult.Status == cmCTestTestHandler::COMPLETED;
  char buf[1024];
  snprintf(buf, sizeof(buf), "%6.2f sec",
           this->TestProcess->GetTotalTime().count());
  outputStream << buf << "\n";

  bool passedOrSkipped = passed || skipped;
  if (this->CTest->GetTestProgressOutput()) {
    if (!passedOrSkipped) {
      // If the test did not pass, reprint test name and error
      std::string output = this->GetTestPrefix(completed, total);
      std::string testName = this->TestProperties->Name;
      const int maxTestNameWidth = this->CTest->GetMaxTestNameWidth();
      testName.resize(maxTestNameWidth + 4, '.');

      output += testName;
      output += outputStream.str();
      outputStream.str("");
      outputStream.clear();
      outputStream << output;
      cmCTestLog(this->CTest, HANDLER_TEST_PROGRESS_OUTPUT, "\n"); // flush
    }
    if (completed == total) {
      std::string testName = this->GetTestPrefix(completed, total) +
        this->TestProperties->Name + "\n";
      cmCTestLog(this->CTest, HANDLER_TEST_PROGRESS_OUTPUT, testName);
    }
  }
  if (!this->CTest->GetTestProgressOutput() || !passedOrSkipped) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, outputStream.str());
  }

  if (outputTestErrorsToConsole) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, this->ProcessOutput << std::endl);
  }

  if (this->TestHandler->LogFile) {
    *this->TestHandler->LogFile << "Test time = " << buf << std::endl;
  }

  this->ParseOutputForMeasurements();

  // if this is doing MemCheck then all the output needs to be put into
  // Output since that is what is parsed by cmCTestMemCheckHandler
  if (!this->TestHandler->MemCheck && started) {
    this->TestHandler->CleanTestOutput(
      this->ProcessOutput,
      static_cast<size_t>(
        this->TestResult.Status == cmCTestTestHandler::COMPLETED
          ? this->TestHandler->CustomMaximumPassedTestOutputSize
          : this->TestHandler->CustomMaximumFailedTestOutputSize),
      this->TestHandler->TestOutputTruncation);
  }
  this->TestResult.Reason = reason;
  if (this->TestHandler->LogFile) {
    bool pass = true;
    const char* reasonType = "Test Pass Reason";
    if (this->TestResult.Status != cmCTestTestHandler::COMPLETED &&
        this->TestResult.Status != cmCTestTestHandler::NOT_RUN) {
      reasonType = "Test Fail Reason";
      pass = false;
    }
    auto ttime = this->TestProcess->GetTotalTime();
    auto hours = std::chrono::duration_cast<std::chrono::hours>(ttime);
    ttime -= hours;
    auto minutes = std::chrono::duration_cast<std::chrono::minutes>(ttime);
    ttime -= minutes;
    auto seconds = std::chrono::duration_cast<std::chrono::seconds>(ttime);
    char buffer[100];
    snprintf(buffer, sizeof(buffer), "%02d:%02d:%02d",
             static_cast<unsigned>(hours.count()),
             static_cast<unsigned>(minutes.count()),
             static_cast<unsigned>(seconds.count()));
    *this->TestHandler->LogFile
      << "----------------------------------------------------------"
      << std::endl;
    if (!this->TestResult.Reason.empty()) {
      *this->TestHandler->LogFile << reasonType << ":\n"
                                  << this->TestResult.Reason << "\n";
    } else {
      if (pass) {
        *this->TestHandler->LogFile << "Test Passed.\n";
      } else {
        *this->TestHandler->LogFile << "Test Failed.\n";
      }
    }
    *this->TestHandler->LogFile
      << "\"" << this->TestProperties->Name
      << "\" end time: " << this->CTest->CurrentTime() << std::endl
      << "\"" << this->TestProperties->Name << "\" time elapsed: " << buffer
      << std::endl
      << "----------------------------------------------------------"
      << std::endl
      << std::endl;
  }
  // if the test actually started and ran
  // record the results in TestResult
  if (started) {
    std::string compressedOutput;
    if (!this->TestHandler->MemCheck &&
        this->CTest->ShouldCompressTestOutput()) {
      std::string str = this->ProcessOutput;
      if (this->CTest->CompressString(str)) {
        compressedOutput = std::move(str);
      }
    }
    bool compress = !compressedOutput.empty() &&
      compressedOutput.length() < this->ProcessOutput.length();
    this->TestResult.Output =
      compress ? compressedOutput : this->ProcessOutput;
    this->TestResult.CompressOutput = compress;
    this->TestResult.ReturnValue = this->TestProcess->GetExitValue();
    if (!skipped) {
      this->TestResult.CompletionStatus = "Completed";
    }
    this->TestResult.ExecutionTime = this->TestProcess->GetTotalTime();
    this->MemCheckPostProcess();
    this->ComputeWeightedCost();
  }
  // If the test does not need to rerun push the current TestResult onto the
  // TestHandler vector
  if (!this->NeedsToRepeat()) {
    this->TestHandler->TestResults.push_back(this->TestResult);
  }
  this->TestProcess.reset();
  return passed || skipped;
}